

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O1

void opensshcert_string_list_key_components
               (key_components *kc,strbuf *input,char *title,char *title2)

{
  char *name;
  long lVar1;
  ulong uVar2;
  bool bVar3;
  ptrlen value;
  char *titles [2];
  BinarySource src [1];
  char *local_68 [2];
  BinarySource local_58;
  
  local_58.data = input->u;
  local_58.len = input->len;
  local_58.binarysource_ = &local_58;
  local_58.pos = 0;
  local_58.err = BSE_NO_ERROR;
  if (local_58.len != 0) {
    uVar2 = 0;
    local_68[0] = title;
    local_68[1] = title2;
    do {
      lVar1 = 0;
      while( true ) {
        value = BinarySource_get_string(local_58.binarysource_);
        if ((local_58.binarysource_)->err != BSE_NO_ERROR) break;
        name = dupprintf("%s_%u",local_68[lVar1],uVar2);
        key_components_add_text_pl(kc,name,value);
        safefree(name);
        if ((title2 == (char *)0x0) || (bVar3 = lVar1 != 0, lVar1 = lVar1 + 1, bVar3)) break;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
    } while ((local_58.binarysource_)->len != (local_58.binarysource_)->pos);
  }
  return;
}

Assistant:

static void opensshcert_string_list_key_components(
    key_components *kc, strbuf *input, const char *title, const char *title2)
{
    BinarySource src[1];
    BinarySource_BARE_INIT_PL(src, ptrlen_from_strbuf(input));

    const char *titles[2] = { title, title2 };
    size_t ntitles = (title2 ? 2 : 1);

    unsigned index = 0;
    while (get_avail(src)) {
        for (size_t ti = 0; ti < ntitles; ti++) {
            ptrlen value = get_string(src);
            if (get_err(src))
                break;
            char *name = dupprintf("%s_%u", titles[ti], index);
            key_components_add_text_pl(kc, name, value);
            sfree(name);
        }
        index++;
    }
}